

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  long lVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  pair<unsigned_long,_bool> pVar8;
  LogFinisher local_59;
  LogMessage local_58;
  
  pbVar6 = this->buffer_;
  pbVar7 = this->buffer_end_;
  if (((int)pbVar7 - (int)pbVar6 < 10) && ((pbVar7 <= pbVar6 || ((char)pbVar7[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = (ulong)(uint)pVar8.first;
    }
  }
  else {
    if (first_byte_or_zero == 0) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1ce);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte_or_zero) != (0): ");
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,"Caller should provide us with *buffer_ when buffer is non-empty");
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
      pbVar6 = this->buffer_;
    }
    if (*pbVar6 != first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x175);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (*buffer) == (first_byte): ");
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
    }
    if (-1 < (char)first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x176);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte & 0x80) == (0x80): ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,first_byte_or_zero);
      internal::LogFinisher::operator=(&local_59,pLVar2);
      internal::LogMessage::~LogMessage(&local_58);
    }
    uVar4 = ((uint)pbVar6[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)pbVar6[1] < '\0') {
      uVar4 = (uVar4 + (uint)pbVar6[2] * 0x4000) - 0x4000;
      if ((char)pbVar6[2] < '\0') {
        uVar4 = (uVar4 + (uint)pbVar6[3] * 0x200000) - 0x200000;
        if ((char)pbVar6[3] < '\0') {
          pbVar7 = pbVar6 + 5;
          uVar4 = uVar4 + (uint)pbVar6[4] * 0x10000000 + 0xf0000000;
          if ((char)pbVar6[4] < '\0') {
            lVar5 = 0;
            do {
              if ((int)lVar5 == 5) {
                return -1;
              }
              lVar1 = lVar5 + 1;
              pbVar6 = pbVar7 + lVar5;
              lVar5 = lVar1;
            } while ((char)*pbVar6 < '\0');
            pbVar7 = pbVar7 + lVar1;
          }
        }
        else {
          pbVar7 = pbVar6 + 4;
        }
      }
      else {
        pbVar7 = pbVar6 + 3;
      }
    }
    else {
      pbVar7 = pbVar6 + 2;
    }
    this->buffer_ = pbVar7;
    uVar3 = (ulong)uVar4;
  }
  return uVar3;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}